

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O3

void __thiscall FileSystemWatcher::notifyReadyRead(FileSystemWatcher *this)

{
  mutex *__mutex;
  int *key;
  int iVar1;
  uint uVar2;
  FileSystemWatcher *this_00;
  pthread_mutex_t *__mutex_00;
  char cVar3;
  int iVar4;
  Type TVar5;
  ssize_t sVar7;
  size_t sVar8;
  ulong __nbytes;
  _Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *this_01;
  Path path;
  String ret;
  int s;
  Log log;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_1220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1218;
  undefined1 local_1210 [16];
  _Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *local_1200;
  FileSystemWatcher *local_11f8;
  _Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *local_11f0;
  _Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *local_11e8;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_11e0;
  uint local_11d8;
  undefined4 uStack_11d4;
  undefined1 local_11d0 [16];
  pthread_mutex_t *local_11c0;
  Log local_11b8;
  Map<int,_Path,_std::less<int>_> *local_11a8;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_1170;
  Log local_1168;
  uint local_1154;
  Log local_1150;
  Log local_1140;
  Log local_1130;
  Log local_1120;
  Log local_1110;
  Log local_1100;
  Log local_10f0;
  Log local_10e0;
  Log local_10d0;
  Log local_10c0;
  Log local_10b0;
  Log local_10a0;
  Log local_1090;
  Log local_1080;
  Log local_1070;
  Log local_1060;
  Log local_1050;
  Log local_1040 [256];
  Log *local_40;
  ulong local_38;
  int iVar6;
  
  if (notifyReadyRead()::dumpFS == '\0') {
    notifyReadyRead();
  }
  if (notifyReadyRead::dumpFS == true) {
    local_1220.mValue = 1;
    Log::Log(local_1040,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_1220);
    Log::write(&local_1100,(int)local_1040,"FileSystemWatcher::notifyReadyRead",0xffffffff);
    if (local_1100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_1040[0].mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1040[0].mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  __mutex = &this->mMutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_1154 = 0;
  ioctl(this->mFd,0x541b,&local_1154);
  __nbytes = (ulong)(int)local_1154;
  if (__nbytes == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    local_11c0 = (pthread_mutex_t *)__mutex;
    local_38 = __nbytes;
    if (local_1154 < 0x1001) {
      local_40 = local_1040;
    }
    else {
      local_40 = (Log *)operator_new__(__nbytes);
    }
    local_11f8 = this;
    sVar7 = read(this->mFd,local_40,__nbytes);
    if (0 < (int)sVar7) {
      local_11a8 = &local_11f8->mWatchedById;
      local_11e8 = (_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *)
                   &local_11f8->mAddedPaths;
      local_11f0 = (_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *)
                   &local_11f8->mRemovedPaths;
      local_1200 = (_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>> *)
                   &local_11f8->mModifiedPaths;
      iVar4 = 0;
      do {
        key = (int *)((long)&(local_40->mData).
                             super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                     (long)iVar4);
        iVar1 = *(int *)((long)&(local_40->mData).
                                super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + (long)iVar4 + 4);
        Map<int,_Path,_std::less<int>_>::value((Path *)&local_1220,local_11a8,key);
        if (local_1218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((notifyReadyRead::dumpFS == true) && (key[1] != 0)) {
            local_1170.mValue = 1;
            Log::Log(&local_1150,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_1170);
            Log::Log(&local_11b8,&local_1150);
            local_11e0.mValue = (int64_t)local_11d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_11e0,local_1220.mValue,
                       (undefined1 *)((long)&local_1218->_vptr__Sp_counted_base + local_1220.mValue)
                      );
            std::__cxx11::string::append((char *)&local_11e0.mValue);
            Log::write(&local_1168,(int)&local_11b8,(void *)local_11e0,(ulong)local_11d8);
            if (local_1168.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1168.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            Log::Log(&local_1110,&local_11b8);
            if (local_1110.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1110.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((undefined1 *)local_11e0.mValue != local_11d0) {
              operator_delete((void *)local_11e0);
            }
            if (local_11b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_11b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            uVar2 = key[1];
            iVar6 = (int)&local_1150;
            if ((uVar2 & 1) != 0) {
              Log::write((Log *)&local_11e0,iVar6,"IN_ACCESS",0xffffffff);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_11d4,local_11d8)
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(uStack_11d4,local_11d8));
              }
            }
            if (((uVar2 & 2) != 0) &&
               (Log::write(&local_1168,iVar6,"IN_MODIFY",0xffffffff),
               local_1168.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1168.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 & 4) != 0) &&
               (Log::write(&local_1050,iVar6,"IN_ATTRIB",0xffffffff),
               local_1050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 & 8) != 0) &&
               (Log::write(&local_1060,iVar6,"IN_CLOSE_WRITE",0xffffffff),
               local_1060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 & 0x10) != 0) &&
               (Log::write(&local_1070,iVar6,"IN_CLOSE_NOWRITE",0xffffffff),
               local_1070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 & 0x18) != 0) &&
               (Log::write(&local_1080,iVar6,"IN_CLOSE",0xffffffff),
               local_1080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 & 0x20) != 0) &&
               (Log::write(&local_1090,iVar6,"IN_OPEN",0xffffffff),
               local_1090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 & 0x40) != 0) &&
               (Log::write(&local_10a0,iVar6,"IN_MOVED_FROM",0xffffffff),
               local_10a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_10a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((char)uVar2 < '\0') &&
               (Log::write(&local_10b0,iVar6,"IN_MOVED_TO",0xffffffff),
               local_10b0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_10b0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 >> 8 & 1) != 0) &&
               (Log::write(&local_10c0,iVar6,"IN_CREATE",0xffffffff),
               local_10c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_10c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 >> 9 & 1) != 0) &&
               (Log::write(&local_10d0,iVar6,"IN_DELETE",0xffffffff),
               local_10d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_10d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 >> 10 & 1) != 0) &&
               (Log::write(&local_10e0,iVar6,"IN_DELETE_SELF",0xffffffff),
               local_10e0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_10e0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (((uVar2 >> 0xb & 1) != 0) &&
               (Log::write(&local_10f0,iVar6,"IN_MOVE_SELF",0xffffffff),
               local_10f0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_10f0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_1150.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1150.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          TVar5 = Path::type((Path *)&local_1220);
          uVar2 = key[1];
          if ((uVar2 & 0x2c00) == 0) {
            if ((uVar2 & 0x180) == 0) {
              if ((uVar2 & 0x240) != 0) {
                if (TVar5 == Directory) {
                  sVar8 = strlen((char *)(key + 4));
                  if (sVar8 != 0) {
                    std::__cxx11::string::append((char *)&local_1220.mValue,(ulong)(key + 4));
                  }
                }
                iVar6 = Set<Path>::remove((Set<Path> *)local_11e8,(char *)&local_1220.mValue);
                cVar3 = (char)iVar6;
                goto LAB_0016ed65;
              }
              if ((uVar2 & 0xc) == 0) goto LAB_0016edcb;
              this_01 = local_1200;
              if (TVar5 == Directory) {
                sVar8 = strlen((char *)(key + 4));
                this_01 = local_1200;
                if (sVar8 != 0) {
                  std::__cxx11::string::append((char *)&local_1220.mValue,(ulong)(key + 4));
                  this_01 = local_1200;
                }
              }
            }
            else {
              if (TVar5 == Directory) {
                sVar8 = strlen((char *)(key + 4));
                if (sVar8 != 0) {
                  std::__cxx11::string::append((char *)&local_1220.mValue,(ulong)(key + 4));
                }
              }
              iVar6 = Set<Path>::remove((Set<Path> *)local_11f0,(char *)&local_1220.mValue);
              this_01 = (_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>>
                         *)&local_11f8->mModifiedPaths;
              if ((char)iVar6 == '\0') {
                this_01 = local_11e8;
              }
            }
          }
          else {
            iVar6 = Set<Path>::remove((Set<Path> *)local_11e8,(char *)&local_1220.mValue);
            cVar3 = (char)iVar6;
LAB_0016ed65:
            this_01 = local_11f0;
            if (cVar3 != '\0') goto LAB_0016edcb;
          }
          std::_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>>::
          _M_insert_unique<Path_const&>(this_01,(Path *)&local_1220);
        }
LAB_0016edcb:
        if ((undefined1 *)local_1220.mValue != local_1210) {
          operator_delete((void *)local_1220);
        }
        iVar4 = iVar4 + iVar1 + 0x10;
      } while (iVar4 < (int)sVar7);
    }
    __mutex_00 = local_11c0;
    this_00 = local_11f8;
    if (notifyReadyRead::dumpFS == true) {
      if ((local_11f8->mAddedPaths).super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_11e0.mValue = 1;
        Log::Log((Log *)&local_1220,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_11e0);
        Log::write((Log *)local_1180,(int)&local_1220,"Added",0xffffffff);
        operator<<(&local_1120,(Set<Path> *)local_1180);
        if (local_1120.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1120.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1180._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1180._8_8_);
        }
        if (local_1218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1218);
        }
      }
      if ((this_00->mRemovedPaths).super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_11e0.mValue = 1;
        Log::Log((Log *)&local_1220,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_11e0);
        Log::write((Log *)local_1190,(int)&local_1220,"Removed",0xffffffff);
        operator<<(&local_1130,(Set<Path> *)local_1190);
        if (local_1130.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1130.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1190._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1190._8_8_);
        }
        if (local_1218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1218);
        }
      }
      if ((this_00->mModifiedPaths).super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_11e0.mValue = 1;
        Log::Log((Log *)&local_1220,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_11e0);
        Log::write((Log *)local_11a0,(int)&local_1220,"Modified",0xffffffff);
        operator<<(&local_1140,(Set<Path> *)local_11a0);
        if (local_1140.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1140.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._8_8_);
        }
        if (local_1218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1218);
        }
      }
    }
    if ((0x1000 < local_38) && (local_40 != (Log *)0x0)) {
      operator_delete__(local_40);
    }
    pthread_mutex_unlock(__mutex_00);
    processChanges(this_00);
  }
  return;
}

Assistant:

void FileSystemWatcher::notifyReadyRead()
{
    static const bool dumpFS = getenv("RTAGS_DUMP_INOTIFY") && !strcmp(getenv("RTAGS_DUMP_INOTIFY"), "1");
    if (dumpFS) {
        error() << "FileSystemWatcher::notifyReadyRead";
    }
    {
        std::lock_guard<std::mutex> lock(mMutex);
        int s = 0;
        ioctl(mFd, FIONREAD, &s);
        if (!s)
            return;

        StackBuffer<4096> buf(s);
        const int read = ::read(mFd, buf, s);
        int idx = 0;
        while (idx < read) {
            inotify_event *event = reinterpret_cast<inotify_event*>(buf + idx);
            idx += sizeof(inotify_event) + event->len;
            Path path = mWatchedById.value(event->wd);
            if (path.isEmpty())
                continue;

            if (dumpFS && event->mask) {
                Log log(LogLevel::Error);
                log << (path + event->name);
                dump(log, event->mask);
            }

            const bool isDir = path.isDir();

            if (event->mask & (IN_DELETE_SELF|IN_MOVE_SELF|IN_UNMOUNT)) {
                add(Remove, path);
            } else if (event->mask & (IN_CREATE|IN_MOVED_TO)) {
                if (isDir)
                    path.append(event->name);
                add(Add, path);
            } else if (event->mask & (IN_DELETE|IN_MOVED_FROM)) {
                if (isDir)
                    path.append(event->name);
                add(Remove, path);
            } else if (event->mask & (IN_ATTRIB|IN_CLOSE_WRITE)) {
                if (isDir)
                    path.append(event->name);
                add(Modified, path);
            }
        }
        if (dumpFS) {
            if (!mAddedPaths.isEmpty())
                error() << "Added" << mAddedPaths;
            if (!mRemovedPaths.isEmpty())
                error() << "Removed" << mRemovedPaths;
            if (!mModifiedPaths.isEmpty())
                error() << "Modified" << mModifiedPaths;
        }
    }
    processChanges();
}